

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:478:59)>
::getImpl(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:478:59)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::Promise<unsigned_long>_> *pEVar1;
  undefined1 local_540 [432];
  Void *local_390;
  Void *depValue;
  Void *_depValue779;
  Exception *local_1d8;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1b8 [8];
  ExceptionOr<kj::_::Void> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:478:59)>
  *this_local;
  
  depResult._408_8_ = output;
  ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)local_1b8);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1b8);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1b8);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<kj::_::Void>
                         ((Maybe<kj::_::Void> *)
                          ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                  details.builder + 0x18));
    if (depValue != (Void *)0x0) {
      local_390 = depValue;
      mv<kj::_::Void>(depValue);
      MaybeVoidCaller<kj::_::Void,kj::Promise<unsigned_long>>::
      apply<kj::(anonymous_namespace)::TestCase464::run()::__2>
                ((Type *)local_540,(Void *)&this->func);
      TransformPromiseNodeBase::handle<kj::Promise<unsigned_long>>
                ((ExceptionOr<kj::Promise<unsigned_long>_> *)(local_540 + 8),
                 &this->super_TransformPromiseNodeBase,(Promise<unsigned_long> *)local_540);
      pEVar1 = ExceptionOrValue::as<kj::Promise<unsigned_long>>
                         ((ExceptionOrValue *)depResult._408_8_);
      ExceptionOr<kj::Promise<unsigned_long>_>::operator=
                (pEVar1,(ExceptionOr<kj::Promise<unsigned_long>_> *)(local_540 + 8));
      ExceptionOr<kj::Promise<unsigned_long>_>::~ExceptionOr
                ((ExceptionOr<kj::Promise<unsigned_long>_> *)(local_540 + 8));
      Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_540);
    }
  }
  else {
    local_1d8 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::Promise<unsigned_long>_>::ExceptionOr
              ((ExceptionOr<kj::Promise<unsigned_long>_> *)&_depValue779,false,exception);
    pEVar1 = ExceptionOrValue::as<kj::Promise<unsigned_long>>((ExceptionOrValue *)depResult._408_8_)
    ;
    ExceptionOr<kj::Promise<unsigned_long>_>::operator=
              (pEVar1,(ExceptionOr<kj::Promise<unsigned_long>_> *)&_depValue779);
    ExceptionOr<kj::Promise<unsigned_long>_>::~ExceptionOr
              ((ExceptionOr<kj::Promise<unsigned_long>_> *)&_depValue779);
  }
  ExceptionOr<kj::_::Void>::~ExceptionOr((ExceptionOr<kj::_::Void> *)local_1b8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }